

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evdevPlus.cpp
# Opt level: O0

ssize_t __thiscall
evdevPlus::EventDevice::read(EventDevice *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  system_error *psVar3;
  int *piVar4;
  error_category *peVar5;
  undefined4 in_register_00000034;
  ssize_t rc;
  EventDevice *this_local;
  InputEvent *ret;
  
  InputEvent::InputEvent((InputEvent *)this);
  sVar2 = ::read(*(int *)CONCAT44(in_register_00000034,__fd),this,0x18);
  if (sVar2 == 0x18) {
    return (ssize_t)this;
  }
  if (sVar2 < 0) {
    psVar3 = (system_error *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    peVar5 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(psVar3,iVar1,peVar5,"read");
    __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  psVar3 = (system_error *)__cxa_allocate_exception(0x20);
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  peVar5 = (error_category *)std::_V2::system_category();
  std::system_error::system_error(psVar3,iVar1,peVar5,"truncated read");
  __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

InputEvent EventDevice::read() {
	InputEvent ret;

	ssize_t rc = ::read(fd_, &ret.event, sizeof(input_event));

	if (rc != sizeof(input_event)) {
		if (rc < 0)
			throw std::system_error(errno, std::system_category(), "read");
		else
			throw std::system_error(errno, std::system_category(), "truncated read");
	}

	return ret;
}